

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<Header>::erase(QGenericArrayOps<Header> *this,Header *b,qsizetype n)

{
  Header *pHVar1;
  long lVar2;
  Header *__last;
  Header *pHVar3;
  
  __last = b + n;
  pHVar1 = (this->super_QArrayDataPointer<Header>).ptr;
  lVar2 = (this->super_QArrayDataPointer<Header>).size;
  pHVar3 = pHVar1 + lVar2;
  if (__last == pHVar3 || pHVar1 != b) {
    for (; __last = b + n, __last != pHVar3; b = b + 1) {
      Header::operator=(b,__last);
    }
    lVar2 = (this->super_QArrayDataPointer<Header>).size;
  }
  else {
    (this->super_QArrayDataPointer<Header>).ptr = __last;
  }
  (this->super_QArrayDataPointer<Header>).size = lVar2 - n;
  std::_Destroy_aux<false>::__destroy<Header*>(b,__last);
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else {
            const T *const end = this->end();

            // move (by assignment) the elements from e to end
            // onto b to the new end
            while (e != end) {
                *b = std::move(*e);
                ++b;
                ++e;
            }
        }
        this->size -= n;
        std::destroy(b, e);
    }